

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1d0ce::TestThrowingTestsAreReportedAsFailures::
~TestThrowingTestsAreReportedAsFailures(TestThrowingTestsAreReportedAsFailures *this)

{
  TestThrowingTestsAreReportedAsFailures *this_local;
  
  ~TestThrowingTestsAreReportedAsFailures(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(ThrowingTestsAreReportedAsFailures)
{
    class CrashingTest : public Test
    {
    public:
        CrashingTest() : Test("throwing") {}
        virtual void RunImpl() const
        {
            throw "Blah";
        }
    };
 
    TestResults results;
	{
		ScopedCurrentTest scopedResult(results);
		CrashingTest().Run();
	}

	CHECK_EQUAL(1, results.GetFailureCount());
}